

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# key.h
# Opt level: O0

void __thiscall winmd::reader::EnumDefinition::EnumDefinition(EnumDefinition *this,TypeDef *type)

{
  uint32_t *values;
  undefined4 uVar1;
  bool bVar2;
  Field *pFVar3;
  const_reference pvVar4;
  TypeSig *this_00;
  value_type *__v;
  ElementType *pEVar5;
  byte local_139;
  FieldSig local_120;
  FieldAttributes local_74;
  FieldAttributes local_72;
  undefined1 local_70 [8];
  value_type field;
  Field __end2;
  Field __begin2;
  pair<winmd::reader::Field,_winmd::reader::Field> *__range2;
  TypeDef *type_local;
  EnumDefinition *this_local;
  
  (this->m_typedef).super_row_base<winmd::reader::TypeDef>.m_table =
       (type->super_row_base<winmd::reader::TypeDef>).m_table;
  uVar1 = *(undefined4 *)&(type->super_row_base<winmd::reader::TypeDef>).field_0xc;
  (this->m_typedef).super_row_base<winmd::reader::TypeDef>.m_index =
       (type->super_row_base<winmd::reader::TypeDef>).m_index;
  *(undefined4 *)&(this->m_typedef).super_row_base<winmd::reader::TypeDef>.field_0xc = uVar1;
  this->m_underlying_type = End;
  TypeDef::FieldList((pair<winmd::reader::Field,_winmd::reader::Field> *)
                     &__begin2.super_row_base<winmd::reader::Field>.m_index,type);
  values = &__begin2.super_row_base<winmd::reader::Field>.m_index;
  pFVar3 = begin<winmd::reader::Field>((pair<winmd::reader::Field,_winmd::reader::Field> *)values);
  __end2.super_row_base<winmd::reader::Field>._8_8_ =
       (pFVar3->super_row_base<winmd::reader::Field>).m_table;
  __begin2.super_row_base<winmd::reader::Field>.m_table =
       *(table_base **)&(pFVar3->super_row_base<winmd::reader::Field>).m_index;
  pFVar3 = end<winmd::reader::Field>((pair<winmd::reader::Field,_winmd::reader::Field> *)values);
  field.super_row_base<winmd::reader::Field>._8_8_ =
       (pFVar3->super_row_base<winmd::reader::Field>).m_table;
  __end2.super_row_base<winmd::reader::Field>.m_table =
       *(table_base **)&(pFVar3->super_row_base<winmd::reader::Field>).m_index;
  while (bVar2 = row_base<winmd::reader::Field>::operator!=
                           ((row_base<winmd::reader::Field> *)
                            &__end2.super_row_base<winmd::reader::Field>.m_index,
                            (row_base<winmd::reader::Field> *)
                            &field.super_row_base<winmd::reader::Field>.m_index), bVar2) {
    pvVar4 = row_base<winmd::reader::Field>::operator*
                       ((row_base<winmd::reader::Field> *)
                        &__end2.super_row_base<winmd::reader::Field>.m_index);
    local_70 = (undefined1  [8])(pvVar4->super_row_base<winmd::reader::Field>).m_table;
    field.super_row_base<winmd::reader::Field>.m_table =
         *(table_base **)&(pvVar4->super_row_base<winmd::reader::Field>).m_index;
    local_72 = Field::Flags((Field *)local_70);
    bVar2 = FieldAttributes::Literal(&local_72);
    local_139 = 0;
    if (!bVar2) {
      local_74 = Field::Flags((Field *)local_70);
      bVar2 = FieldAttributes::Static(&local_74);
      local_139 = bVar2 ^ 0xff;
    }
    if ((local_139 & 1) != 0) {
      Field::Signature(&local_120,(Field *)local_70);
      this_00 = FieldSig::Type(&local_120);
      __v = TypeSig::Type(this_00);
      pEVar5 = std::
               get<winmd::reader::ElementType,winmd::reader::ElementType,winmd::reader::coded_index<winmd::reader::TypeDefOrRef>,winmd::reader::GenericTypeIndex,winmd::reader::GenericTypeInstSig,winmd::reader::GenericMethodTypeIndex>
                         (__v);
      this->m_underlying_type = *pEVar5;
      FieldSig::~FieldSig(&local_120);
    }
    row_base<winmd::reader::Field>::operator++
              ((row_base<winmd::reader::Field> *)
               &__end2.super_row_base<winmd::reader::Field>.m_index);
  }
  return;
}

Assistant:

explicit EnumDefinition(TypeDef const& type)
            : m_typedef(type)
        {
            XLANG_ASSERT(type.is_enum());
            for (auto field : type.FieldList())
            {
                if (!field.Flags().Literal() && !field.Flags().Static())
                {
                    XLANG_ASSERT(m_underlying_type == ElementType::End);
                    m_underlying_type = std::get<ElementType>(field.Signature().Type().Type());
                    XLANG_ASSERT(ElementType::Boolean <= m_underlying_type && m_underlying_type <= ElementType::U8);
                }
            }
        }